

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy.h
# Opt level: O3

bool __thiscall
snmalloc::
Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
::remove_buddy(Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
               *this,Contents addr,size_t size)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  K KVar4;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *this_00;
  long lVar5;
  RBPath path;
  undefined8 uStack_828;
  RBPath local_820;
  
  uVar1 = 0x3f;
  if (size - 1 != 0) {
    for (; size - 1 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  uVar3 = 0xfffffffffffffffc;
  if (size != 1) {
    uVar3 = (uVar1 ^ 0xffffffffffffffc0) + 0x3d;
  }
  if (uVar3 < this->empty_at_or_above) {
    KVar4.unsafe_capptr =
         (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          *)((size * -2 ^ size) & (ulong)addr.unsafe_capptr ^ size);
    lVar5 = 0;
    do {
      if (*(FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            **)((long)&(this->entries)._M_elems[uVar3].cache[0].unsafe_capptr + lVar5) ==
          KVar4.unsafe_capptr) {
        KVar4 = RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                ::remove_min(&(this->entries)._M_elems[uVar3].tree);
        *(FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          **)((long)&(this->entries)._M_elems[uVar3].cache[0].unsafe_capptr + lVar5) =
             KVar4.unsafe_capptr;
        return true;
      }
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x18);
    lVar5 = 8;
    do {
      *(undefined8 *)((long)&uStack_828 + lVar5) = 0;
      *(undefined1 *)((long)&local_820.path._M_elems[0].node.ptr.val + lVar5) = 0;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x808);
    this_00 = &(this->entries)._M_elems[uVar3].tree;
    local_820.path._M_elems[0].dir = false;
    local_820.length = 1;
    local_820.path._M_elems[0].node.ptr.val = (H)(H)this_00;
    bVar2 = RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
            ::find(this_00,&local_820,KVar4);
    if (bVar2) {
      RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
      ::remove_path(this_00,&local_820);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool remove_buddy(typename Rep::Contents addr, size_t size)
    {
      auto idx = to_index(size);

      // Empty at this range.
      if (idx >= empty_at_or_above)
        return false;

      auto buddy = Rep::buddy(addr, size);

      // Check local cache first
      for (auto& e : entries[idx].cache)
      {
        if (Rep::equal(buddy, e))
        {
          if (!Rep::can_consolidate(addr, size))
            return false;

          e = entries[idx].tree.remove_min();
          return true;
        }
      }

      auto path = entries[idx].tree.get_root_path();
      bool contains_buddy = entries[idx].tree.find(path, buddy);

      if (!contains_buddy)
        return false;

      // Only check if we can consolidate after we know the buddy is in
      // the buddy allocator.  This is required to prevent possible segfaults
      // from looking at the buddies meta-data, which we only know exists
      // once we have found it in the red-black tree.
      if (!Rep::can_consolidate(addr, size))
        return false;

      entries[idx].tree.remove_path(path);
      return true;
    }